

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O0

void __thiscall ASDCP::Dictionary::Dump(Dictionary *this,FILE *stream)

{
  char *pcVar1;
  undefined1 local_88 [8];
  UL TmpUL;
  char str_buf [64];
  uint local_1c;
  FILE *pFStack_18;
  MDD_t di;
  FILE *stream_local;
  Dictionary *this_local;
  
  pFStack_18 = (FILE *)stream;
  if (stream == (FILE *)0x0) {
    pFStack_18 = _stderr;
  }
  for (local_1c = 0; (int)local_1c < 0x246; local_1c = local_1c + 1) {
    if (this->m_MDD_Table[local_1c].name != (char *)0x0) {
      UL::UL((UL *)local_88,this->m_MDD_Table[local_1c].ul);
      pcVar1 = UL::EncodeString((UL *)local_88,(char *)(TmpUL.super_Identifier<16U>.m_Value + 0xf),
                                0x40);
      fprintf(pFStack_18,"%s: %s\n",pcVar1,this->m_MDD_Table[local_1c].name);
      UL::~UL((UL *)local_88);
    }
  }
  return;
}

Assistant:

void
ASDCP::Dictionary::Dump(FILE* stream) const
{
  if ( stream == 0 )
    stream = stderr;

  MDD_t di = (MDD_t)0;
  char     str_buf[64];

  while ( di < MDD_Max )
    {
      if ( m_MDD_Table[di].name != 0 )
	{
	  UL TmpUL(m_MDD_Table[di].ul);
	  fprintf(stream, "%s: %s\n", TmpUL.EncodeString(str_buf, 64), m_MDD_Table[di].name);
	}

      di = (MDD_t)(di + 1);
    }
}